

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_export.cpp
# Opt level: O0

CopyFunction * __thiscall
duckdb::LogicalExport::GetCopyFunction(LogicalExport *this,ClientContext *context,CopyInfo *info)

{
  string *schema_name;
  CopyFunctionCatalogEntry *pCVar1;
  long in_RCX;
  CopyFunction *in_RDI;
  CopyFunctionCatalogEntry *copy_entry;
  string *in_stack_ffffffffffffff30;
  string *catalog_name;
  optional_idx error_context;
  optional_idx local_98;
  QueryErrorContext local_90;
  undefined1 local_81 [56];
  allocator local_49;
  string local_48 [32];
  CopyFunctionCatalogEntry *local_28;
  long local_20;
  
  error_context.index = (idx_t)in_RDI;
  local_20 = in_RCX;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,anon_var_dwarf_3eb64fd + 9,&local_49);
  catalog_name = (string *)local_81;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(local_81 + 1),"main",(allocator *)catalog_name);
  schema_name = (string *)(local_20 + 0x90);
  optional_idx::optional_idx(&local_98);
  QueryErrorContext::QueryErrorContext(&local_90,local_98);
  pCVar1 = Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                     ((ClientContext *)in_RDI,catalog_name,schema_name,in_stack_ffffffffffffff30,
                      (QueryErrorContext)error_context.index);
  ::std::__cxx11::string::~string((string *)(local_81 + 1));
  ::std::allocator<char>::~allocator((allocator<char> *)local_81);
  ::std::__cxx11::string::~string(local_48);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_28 = pCVar1;
  CopyFunction::CopyFunction((CopyFunction *)error_context.index,in_RDI);
  return (CopyFunction *)error_context.index;
}

Assistant:

CopyFunction LogicalExport::GetCopyFunction(ClientContext &context, CopyInfo &info) {
	auto &copy_entry =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, info.format);
	return copy_entry.function;
}